

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::CaptureNoImplicitCallUses
          (GlobOpt *this,Opnd *opnd,bool usesNoMissingValuesInfo,Instr *includeCurrentInstr)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType_00;
  undefined4 *puVar3;
  Opnd *this_00;
  PragmaInstr *this_01;
  Opnd *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3510,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) goto LAB_0042c50f;
    *puVar3 = 0;
  }
  if (this->noImplicitCallUsesToInsert == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3511,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar2) goto LAB_0042c50f;
    *puVar3 = 0;
  }
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3512,"(opnd)","opnd");
    if (!bVar2) {
LAB_0042c50f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = IR::Opnd::Copy(opnd,this->func);
  local_40 = this_00;
  if (!usesNoMissingValuesInfo) {
    local_32[0] = (this_00->m_valueType).field_0;
    bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
    if (bVar2) {
      bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
      if (bVar2) {
        valueType_00 = ValueType::SetHasNoMissingValues((ValueType *)&local_32[0].field_0,false);
        IR::Opnd::SetValueType(this_00,valueType_00);
      }
    }
  }
  if (includeCurrentInstr == (Instr *)0x0) {
    JsUtil::
    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this->noImplicitCallUsesToInsert,&local_40);
  }
  else {
    this_01 = IR::PragmaInstr::New(NoImplicitCallUses,0,includeCurrentInstr->m_func);
    IR::Instr::SetSrc1(&this_01->super_Instr,this_00);
    IR::Opnd::SetIsJITOptimizedReg((this_01->super_Instr).m_src1,true);
    IR::Instr::InsertAfter(includeCurrentInstr,&this_01->super_Instr);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureNoImplicitCallUses(
    IR::Opnd *opnd,
    const bool usesNoMissingValuesInfo,
    IR::Instr *const includeCurrentInstr)
{
    Assert(!IsLoopPrePass());
    Assert(noImplicitCallUsesToInsert);
    Assert(opnd);

    // The opnd may be deleted later, so make a copy to ensure it is alive for inserting NoImplicitCallUses later
    opnd = opnd->Copy(func);

    if(!usesNoMissingValuesInfo)
    {
        const ValueType valueType(opnd->GetValueType());
        if(valueType.IsArrayOrObjectWithArray() && valueType.HasNoMissingValues())
        {
            // Inserting NoImplicitCallUses for an opnd with a definitely-array-with-no-missing-values value type means that the
            // instruction following it uses the information that the array has no missing values in some way, for instance, it
            // may omit missing value checks. Based on that, the dead-store phase in turn ensures that the necessary bailouts
            // are inserted to ensure that the array still has no missing values until the following instruction. Since
            // 'usesNoMissingValuesInfo' is false, change the value type to indicate to the dead-store phase that the following
            // instruction does not use the no-missing-values information.
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
    }

    if(includeCurrentInstr)
    {
        IR::Instr *const noImplicitCallUses =
            IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, includeCurrentInstr->m_func);
        noImplicitCallUses->SetSrc1(opnd);
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        includeCurrentInstr->InsertAfter(noImplicitCallUses);
        return;
    }

    noImplicitCallUsesToInsert->Add(opnd);
}